

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemoryManager.cpp
# Opt level: O3

void __thiscall Lodtalk::GarbageCollector::unregisterGCRoot(GarbageCollector *this,Oop *gcroot)

{
  pointer ppVar1;
  pointer ppVar2;
  unsigned_long *puVar3;
  ulong uVar4;
  long lVar5;
  ulong uVar6;
  unsigned_long *puVar7;
  unique_lock<std::mutex> l;
  unique_lock<std::mutex> local_28;
  
  local_28._M_device = &this->controlMutex;
  local_28._M_owns = false;
  std::unique_lock<std::mutex>::lock(&local_28);
  local_28._M_owns = true;
  ppVar1 = (this->rootPointers).
           super__Vector_base<std::pair<Lodtalk::Oop_*,_unsigned_long>,_std::allocator<std::pair<Lodtalk::Oop_*,_unsigned_long>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  ppVar2 = (this->rootPointers).
           super__Vector_base<std::pair<Lodtalk::Oop_*,_unsigned_long>,_std::allocator<std::pair<Lodtalk::Oop_*,_unsigned_long>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (ppVar2 != ppVar1) {
    puVar3 = &ppVar1[1].second;
    uVar4 = 0;
    do {
      if (ppVar1[uVar4].first == gcroot) {
        if ((ppVar1 + uVar4 + 1 != ppVar2) &&
           (lVar5 = (long)ppVar2 - (long)(ppVar1 + uVar4 + 1) >> 4, 0 < lVar5)) {
          uVar6 = lVar5 + 1;
          puVar7 = puVar3;
          do {
            puVar7[-3] = (unsigned_long)
                         ((pair<Lodtalk::Oop_*,_unsigned_long> *)(puVar7 + -1))->first;
            puVar7[-2] = *puVar7;
            uVar6 = uVar6 - 1;
            puVar7 = puVar7 + 2;
          } while (1 < uVar6);
        }
        ppVar2 = ppVar2 + -1;
        (this->rootPointers).
        super__Vector_base<std::pair<Lodtalk::Oop_*,_unsigned_long>,_std::allocator<std::pair<Lodtalk::Oop_*,_unsigned_long>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = ppVar2;
      }
      uVar4 = uVar4 + 1;
      puVar3 = puVar3 + 2;
    } while (uVar4 < (ulong)((long)ppVar2 - (long)ppVar1 >> 4));
  }
  std::unique_lock<std::mutex>::~unique_lock(&local_28);
  return;
}

Assistant:

void GarbageCollector::unregisterGCRoot(Oop *gcroot)
{
	std::unique_lock<std::mutex> l(controlMutex);
	for(size_t i = 0; i < rootPointers.size(); ++i)
	{
		if(rootPointers[i].first == gcroot)
			rootPointers.erase(rootPointers.begin() + i);
	}
}